

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

bool * __thiscall
google::protobuf::Reflection::GetRawSplit<bool>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  bool *pbVar4;
  LogMessageFatal local_50 [32];
  
  this_00 = &this->schema_;
  bVar2 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar2) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/message.h"
               ,0x642,0x1b,"!schema_.InRealOneof(field)");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_50,8,"Field = ");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)local_50,(string *)(field->all_names_ + 1));
    if (bVar2) goto LAB_0028bcd0;
  }
  if ((this->schema_).split_offset_ != -1) {
    uVar3 = internal::ReflectionSchema::SplitOffset(this_00);
    lVar1 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
    uVar3 = internal::ReflectionSchema::GetFieldOffsetNonOneof(this_00,field);
    bVar2 = internal::SplitFieldHasExtraIndirection(field);
    pbVar4 = (bool *)((ulong)uVar3 + lVar1);
    if (bVar2) {
      pbVar4 = *(bool **)pbVar4;
    }
    return pbVar4;
  }
  GetRawSplit<bool>();
LAB_0028bcd0:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}